

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

void * rw::ps2::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = (long)nativeRasterOffset;
  *(undefined8 *)((long)object + lVar2) = 0;
  *(undefined4 *)((long)object + lVar2 + 8) = 0;
  *(undefined2 *)((long)object + lVar2 + 0xc) = (undefined2)defaultMipMapKL;
  *(undefined4 *)((long)object + lVar2 + 0x38) = 0;
  *(undefined8 *)((long)object + lVar2 + 0x30) = 0;
  puVar1 = (undefined8 *)((long)object + lVar2 + 0xe);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)object + lVar2 + 0x1d);
  *puVar1 = 0;
  puVar1[1] = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	Ps2Raster *raster = GETPS2RASTEREXT(object);
	raster->tex0 = 0;
	raster->paletteBase = 0;
	raster->kl = defaultMipMapKL;
	raster->tex1low = 0;
	raster->unk2 = 0;
	raster->miptbp1 = 0;
	raster->miptbp2 = 0;
	raster->pixelSize = 0;
	raster->paletteSize = 0;
	raster->totalSize = 0;
	raster->flags = 0;

	raster->dataSize = 0;
	raster->data = nil;
	return object;
}